

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::dereference_expression
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *expr_type,string *expr)

{
  bool bVar1;
  char *pcVar2;
  string local_50;
  spirv_cross local_29;
  string *local_28;
  string *expr_local;
  SPIRType *expr_type_local;
  CompilerGLSL *this_local;
  
  local_28 = expr;
  expr_local = (string *)expr_type;
  expr_type_local = (SPIRType *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  pcVar2 = (char *)::std::__cxx11::string::front();
  if (*pcVar2 == '&') {
    ::std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)local_28);
  }
  else if (((this->backend).native_pointers & 1U) == 0) {
    bVar1 = Compiler::is_physical_pointer(&this->super_Compiler,(SPIRType *)expr_local);
    if ((!bVar1) ||
       (bVar1 = Compiler::is_physical_pointer_to_buffer_block
                          (&this->super_Compiler,(SPIRType *)expr_local), bVar1)) {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_28);
    }
    else {
      enclose_expression(&local_50,this,local_28);
      join<std::__cxx11::string,char_const(&)[7]>
                (__return_storage_ptr__,(spirv_cross *)&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".value",
                 (char (*) [7])expr);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
  }
  else {
    local_29 = (spirv_cross)0x2a;
    join<char,std::__cxx11::string_const&>(__return_storage_ptr__,&local_29,(char *)local_28,expr);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::dereference_expression(const SPIRType &expr_type, const std::string &expr)
{
	// If this expression starts with an address-of operator ('&'), then
	// just return the part after the operator.
	// TODO: Strip parens if unnecessary?
	if (expr.front() == '&')
		return expr.substr(1);
	else if (backend.native_pointers)
		return join('*', expr);
	else if (is_physical_pointer(expr_type) && !is_physical_pointer_to_buffer_block(expr_type))
		return join(enclose_expression(expr), ".value");
	else
		return expr;
}